

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_ksdt.c
# Opt level: O3

void lda_xc_ksdt_init(xc_func_type *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  double *pdVar19;
  double dVar20;
  double dVar21;
  void *__dest;
  long lVar22;
  long *plVar23;
  long lVar24;
  long extraout_RDX;
  long in_RSI;
  lda_xc_ksdt_params *__src;
  long *plVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double __x;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dStack_248;
  
  plVar25 = (long *)0x130;
  __dest = malloc(0x130);
  p->params = __dest;
  uVar18 = p->info->number;
  plVar23 = (long *)(ulong)uVar18;
  if (uVar18 == 0x241) {
    __src = &par_gdsmfb;
  }
  else if (uVar18 == 0x13e) {
    __src = &par_corrksdt;
  }
  else {
    if (uVar18 != 0x103) {
      lda_xc_ksdt_init_cold_1();
      if (in_RSI != 0) {
        lVar26 = 0;
        do {
          lVar22 = (int)plVar25[9] * lVar26;
          dVar27 = *(double *)(extraout_RDX + lVar22 * 8);
          if ((int)plVar25[1] == 2) {
            dVar27 = dVar27 + *(double *)(extraout_RDX + 8 + lVar22 * 8);
          }
          dVar38 = (double)plVar25[0x30];
          if (dVar38 <= dVar27) {
            dVar27 = *(double *)(extraout_RDX + lVar22 * 8);
            if (dVar27 <= dVar38) {
              dVar27 = dVar38;
            }
            pdVar19 = (double *)plVar25[0x2f];
            dVar28 = cbrt(9.0);
            dVar29 = cbrt(0.3183098861837907);
            dVar46 = dVar28 * dVar28;
            dVar30 = 1.0 / (dVar29 * 0.3183098861837907);
            dVar38 = *pdVar19;
            dVar40 = (1.0 / dVar38) * 1.4422495703074083;
            dVar31 = cbrt(dVar27);
            dVar41 = dVar31 * dVar31;
            dVar20 = dVar40 * dVar41;
            dVar32 = tanh((dVar46 * dVar30 * dVar20) / 6.0);
            dVar33 = dVar29 * dVar29 * 0.10132118364233778;
            dVar1 = *pdVar19;
            dVar49 = dVar1 * dVar1;
            dVar51 = (1.0 / dVar31) / dVar27;
            dVar42 = dVar49 * 1.4422495703074083 * dVar51;
            dVar53 = dVar46 * dVar33 * dVar42;
            dVar47 = (1.0 / (dVar27 * dVar27)) * dVar1 * dVar49;
            dVar21 = dVar29 / 306.0196847852814;
            dVar55 = 1.0 / dVar41;
            dVar43 = dVar55 / (dVar27 * dVar27);
            dVar50 = dVar49 * dVar49 * 2.080083823051904;
            dVar54 = dVar43 * dVar50;
            dVar44 = dVar28 * dVar21 * dVar54;
            dVar48 = dVar29 * 0.3183098861837907 * dVar28;
            dVar27 = dVar1 * 2.080083823051904 * dVar48 * dVar55;
            if (dVar27 < 0.0) {
              dVar27 = sqrt(dVar27);
            }
            else {
              dVar27 = SQRT(dVar27);
            }
            dVar34 = tanh(2.121320343559643 / dVar27);
            dVar27 = pdVar19[3];
            dVar1 = pdVar19[4];
            dVar2 = pdVar19[2];
            dVar3 = pdVar19[5];
            dVar4 = pdVar19[6];
            __x = (1.0 / dVar31) * 2.519842099789747 * dVar29 * 1.4422495703074083;
            if (__x < 0.0) {
              dStack_248 = sqrt(__x);
            }
            else {
              dStack_248 = SQRT(__x);
            }
            dVar5 = pdVar19[0xd];
            dVar35 = exp((dVar20 * -pdVar19[0xe] * dVar46 * dVar30) / 6.0);
            dVar20 = pdVar19[0xc];
            dVar56 = pdVar19[0x1d];
            dVar57 = pdVar19[0x1e];
            dVar6 = pdVar19[0x1c];
            dVar7 = pdVar19[0x1f];
            dVar8 = pdVar19[0x20];
            dVar9 = pdVar19[0x13];
            dVar10 = pdVar19[0x14];
            dVar11 = pdVar19[0x12];
            dVar12 = pdVar19[0x15];
            dVar13 = pdVar19[0x16];
            dVar48 = dVar48 * *pdVar19;
            dVar55 = dVar55 * 2.080083823051904;
            dVar14 = (double)plVar25[0x31];
            dVar36 = exp(dVar48 * -0.2222222222222222 * dVar55 *
                         (dVar48 * 0.06361833333333333 * dVar55 * dStack_248 + 1.064009));
            dVar36 = 2.0 - dVar36 * (1.0 / (__x * 0.045802 + 1.0)) *
                                    (__x * -0.003481525 + 0.6666666666666666);
            dVar37 = pow((double)plVar25[0x31],dVar36);
            dVar36 = exp2(dVar36);
            dVar38 = tanh(((1.0 / dVar38) * dVar46 * dVar30 * 1.4422495703074083 * dVar41 *
                          1.5874010519681996) / 6.0);
            dVar45 = dVar51 * 1.4422495703074083 * dVar46 * dVar33 * dVar49 * 1.5874010519681996;
            dVar49 = dVar43 * 2.080083823051904 * dVar28 * dVar21 * dVar49 * dVar49 *
                     1.2599210498948732;
            dVar51 = dVar55 * dVar48 * 1.2599210498948732;
            if (dVar51 < 0.0) {
              dVar51 = sqrt(dVar51);
            }
            else {
              dVar51 = SQRT(dVar51);
            }
            dVar39 = tanh(3.0 / dVar51);
            dVar51 = pdVar19[8];
            dVar52 = dVar42 * 1.5874010519681996;
            dVar48 = pdVar19[9];
            dVar55 = pdVar19[7];
            dVar15 = pdVar19[10];
            dVar16 = pdVar19[0xb];
            dVar17 = pdVar19[0x10];
            dVar40 = exp((dVar41 * dVar40 * dVar30 * pdVar19[0x11] * dVar46 * 1.5874010519681996) /
                         -6.0);
            lVar22 = *plVar23;
            if ((lVar22 != 0) && ((*(byte *)(*plVar25 + 0x40) & 1) != 0)) {
              dVar57 = dVar57 * dVar28 * dVar21 * 0.19753086419753085 * dVar54 +
                       dVar56 * dVar46 * dVar33 * 0.14814814814814814 * dVar42 + dVar6;
              dVar29 = 1.0 / dVar29;
              dVar56 = 1.0 / (dVar8 * dVar28 * dVar21 * 0.19753086419753085 * dVar54 +
                             dVar7 * dVar46 * dVar33 * 0.14814814814814814 * dVar42 + 1.0);
              dVar30 = (double)(~-(ulong)(1.0 <= dVar14) & 0x3ff0000000000000 |
                               (ulong)dVar37 & -(ulong)(1.0 <= dVar14));
              dVar41 = (1.0 / (dVar36 + -2.0)) * (dVar30 + dVar30 + -2.0);
              dVar50 = dVar43 * 1.2599210498948732 * dVar50;
              dVar30 = pdVar19[0x23] * dVar28 * dVar21 * 0.024691358024691357 * dVar50 +
                       (pdVar19[0x22] * dVar46 * dVar33 * dVar52) / 27.0 + pdVar19[0x21];
              dVar43 = 1.0 / (pdVar19[0x25] * dVar28 * dVar21 * 0.024691358024691357 * dVar50 +
                             (pdVar19[0x24] * dVar46 * dVar33 * dVar52) / 27.0 + 1.0);
              lVar24 = (int)plVar25[0xb] * lVar26;
              *(double *)(lVar22 + lVar24 * 8) =
                   ((1.0 / (dVar30 * dVar38 * dVar43 * __x * 0.25 +
                           (1.0 / (dVar28 * pdVar19[0x1b] * dVar21 * 0.024691358024691357 * dVar50 +
                                  (dVar46 * pdVar19[0x1a] * dVar33 * dVar52) / 27.0 + 1.0)) *
                           dStack_248 *
                           (pdVar19[0x19] * dVar28 * dVar21 * 0.024691358024691357 * dVar50 +
                           (pdVar19[0x18] * dVar46 * dVar33 * dVar52) / 27.0 + pdVar19[0x17]) *
                           dVar39 * 0.5 + 1.0)) * dVar31 * dVar41 *
                   dVar29 * 1.5874010519681996 *
                   (dVar30 * dVar43 * (dVar17 * dVar40 + pdVar19[0xf]) * dVar38 * __x * 0.25 +
                   (1.0 / (dVar16 * dVar28 * dVar21 * 0.024691358024691357 * dVar50 +
                          (dVar15 * dVar46 * dVar33 * dVar52) / 27.0 + 1.0)) * dStack_248 *
                   (dVar48 * dVar28 * dVar21 * 0.024691358024691357 * dVar50 +
                   (dVar51 * dVar46 * dVar33 * dVar52) / 27.0 + dVar55) * dVar39 * 0.5 +
                   (1.0 / (dVar49 * 0.12618518518518518 + dVar45 * 0.30779666666666666 + 1.0)) *
                   dVar28 * 2.519842099789747 * 0.4010453259925992 * dVar29 * dVar38 *
                   (dVar49 * 0.042061728395061726 +
                   dVar47 * -0.00021049826280882748 + dVar45 * 0.11272703703703704 + 0.75) * 0.25) *
                   -2.080083823051904) / 3.0 +
                   ((dVar56 * dVar57 * (dVar35 * dVar5 + dVar20) * dVar32 * __x * 0.25 +
                    (1.0 / (dVar4 * dVar28 * dVar21 * 0.19753086419753085 * dVar54 +
                           dVar3 * dVar46 * dVar33 * 0.14814814814814814 * dVar42 + 1.0)) *
                    dStack_248 *
                    (dVar1 * dVar28 * dVar21 * 0.19753086419753085 * dVar54 +
                    dVar27 * dVar46 * dVar33 * 0.14814814814814814 * dVar42 + dVar2) * dVar34 * 0.5
                    + (1.0 / (dVar44 * 1.0094814814814814 + dVar53 * 1.2311866666666667 + 1.0)) *
                      dVar28 * 0.8020906519851985 * dVar29 * dVar32 *
                      (dVar44 * 0.3364938271604938 +
                      dVar47 * -0.0008419930512353099 + dVar53 * 0.45090814814814817 + 0.75) * 0.25)
                    * -2.080083823051904 * dVar29 *
                   dVar31 * 1.5874010519681996 *
                   (1.0 - dVar41) *
                   (1.0 / (dVar32 * dVar57 * dVar56 * __x * 0.25 +
                          (1.0 / (dVar13 * dVar28 * dVar21 * 0.19753086419753085 * dVar54 +
                                 dVar12 * dVar46 * dVar33 * 0.14814814814814814 * dVar42 + 1.0)) *
                          dStack_248 *
                          (dVar10 * dVar28 * dVar21 * 0.19753086419753085 * dVar54 +
                          dVar9 * dVar46 * dVar33 * 0.14814814814814814 * dVar42 + dVar11) * dVar34
                          * 0.5 + 1.0))) / 3.0 + *(double *)(lVar22 + lVar24 * 8);
            }
          }
          lVar26 = lVar26 + 1;
        } while (in_RSI != lVar26);
      }
      return;
    }
    __src = &par_ksdt;
  }
  memcpy(__dest,__src,0x130);
  return;
}

Assistant:

static void
lda_xc_ksdt_init(xc_func_type *p)
{
  lda_xc_ksdt_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_xc_ksdt_params));
  params = (lda_xc_ksdt_params *)(p->params);

  switch(p->info->number){
  case XC_LDA_XC_KSDT:
    libxc_memcpy(params, &par_ksdt, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_GDSMFB:
    libxc_memcpy(params, &par_gdsmfb, sizeof(lda_xc_ksdt_params));
    break;
  case XC_LDA_XC_CORRKSDT:
    libxc_memcpy(params, &par_corrksdt, sizeof(lda_xc_ksdt_params));
    break;
  default:
    fprintf(stderr, "Internal error in lda_xc_ksdt\n");
    exit(1);
  }
}